

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O1

StatisticObject Clasp::StatisticObject::fromRep(uint64 x)

{
  reference ppIVar1;
  void *pvVar2;
  StatisticObject local_8;
  
  if (x == 0) {
    return (StatisticObject)0;
  }
  local_8.handle_ = x;
  ppIVar1 = bk_lib::
            pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
            ::at((pod_vector<const_Clasp::StatisticObject::I_*,_std::allocator<const_Clasp::StatisticObject::I_*>_>
                  *)types_s,(uint)(ushort)(x >> 0x30));
  if ((*ppIVar1 != (I *)0x0) && (pvVar2 = self(&local_8), ((ulong)pvVar2 & 3) == 0)) {
    return (StatisticObject)local_8.handle_;
  }
  Potassco::fail(-2,"static StatisticObject Clasp::StatisticObject::fromRep(uint64)",99,
                 "r.tid() != 0 && (reinterpret_cast<uintp>(r.self()) & 3u) == 0","invalid key",0);
}

Assistant:

StatisticObject StatisticObject::fromRep(uint64 x) {
	if (!x) { return StatisticObject(0, 0); }
	StatisticObject r;
	r.handle_ = x;
	POTASSCO_REQUIRE(r.tid() != 0 && (reinterpret_cast<uintp>(r.self()) & 3u) == 0, "invalid key");
	return r;
}